

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodea_io.c
# Opt level: O0

int CVodeGetAdjCheckPointsInfo(void *cvode_mem,CVadjCheckPointRec *ckpnt)

{
  long in_RSI;
  CVodeMem in_RDI;
  int i;
  CVckpntMem ck_mem;
  CVadjMem ca_mem;
  CVodeMem cv_mem;
  int local_34;
  CVckpntMemRec *local_30;
  int local_4;
  
  if (in_RDI == (CVodeMem)0x0) {
    cvProcessError((CVodeMem)0x0,-0x15,0x276,"CVodeGetAdjCheckPointsInfo",
                   "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvodes/cvodea_io.c"
                   ,"cvode_mem = NULL illegal.");
    local_4 = -0x15;
  }
  else if (in_RDI->cv_adjMallocDone == 0) {
    cvProcessError(in_RDI,-0x65,0x27e,"CVodeGetAdjCheckPointsInfo",
                   "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvodes/cvodea_io.c"
                   ,"Illegal attempt to call before calling CVodeAdjMalloc.");
    local_4 = -0x65;
  }
  else {
    local_30 = in_RDI->cv_adj_mem->ck_mem;
    local_34 = 0;
    for (; local_30 != (CVckpntMemRec *)0x0; local_30 = local_30->ck_next) {
      *(CVckpntMemRec **)(in_RSI + (long)local_34 * 0x38) = local_30;
      *(CVckpntMemRec **)(in_RSI + (long)local_34 * 0x38 + 8) = local_30->ck_next;
      *(sunrealtype *)(in_RSI + (long)local_34 * 0x38 + 0x10) = local_30->ck_t0;
      *(sunrealtype *)(in_RSI + (long)local_34 * 0x38 + 0x18) = local_30->ck_t1;
      *(long *)(in_RSI + (long)local_34 * 0x38 + 0x20) = local_30->ck_nst;
      *(int *)(in_RSI + (long)local_34 * 0x38 + 0x28) = local_30->ck_q;
      *(sunrealtype *)(in_RSI + (long)local_34 * 0x38 + 0x30) = local_30->ck_h;
      local_34 = local_34 + 1;
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int CVodeGetAdjCheckPointsInfo(void* cvode_mem, CVadjCheckPointRec* ckpnt)
{
  CVodeMem cv_mem;
  CVadjMem ca_mem;
  CVckpntMem ck_mem;
  int i;

  /* Check if cvode_mem exists */
  if (cvode_mem == NULL)
  {
    cvProcessError(NULL, CV_MEM_NULL, __LINE__, __func__, __FILE__, MSGCV_NO_MEM);
    return (CV_MEM_NULL);
  }
  cv_mem = (CVodeMem)cvode_mem;

  /* Was ASA initialized? */
  if (cv_mem->cv_adjMallocDone == SUNFALSE)
  {
    cvProcessError(cv_mem, CV_NO_ADJ, __LINE__, __func__, __FILE__, MSGCV_NO_ADJ);
    return (CV_NO_ADJ);
  }
  ca_mem = cv_mem->cv_adj_mem;

  ck_mem = ca_mem->ck_mem;

  i = 0;

  while (ck_mem != NULL)
  {
    ckpnt[i].my_addr   = (void*)ck_mem;
    ckpnt[i].next_addr = (void*)ck_mem->ck_next;
    ckpnt[i].t0        = ck_mem->ck_t0;
    ckpnt[i].t1        = ck_mem->ck_t1;
    ckpnt[i].nstep     = ck_mem->ck_nst;
    ckpnt[i].order     = ck_mem->ck_q;
    ckpnt[i].step      = ck_mem->ck_h;

    ck_mem = ck_mem->ck_next;
    i++;
  }

  return (CV_SUCCESS);
}